

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::EnumValueOptions::MergeFrom(EnumValueOptions *this,EnumValueOptions *from)

{
  bool bVar1;
  void *pvVar2;
  Rep *pRVar3;
  LogMessage *pLVar4;
  void **our_elems;
  int iVar5;
  LogFinisher local_99;
  LogMessage local_98;
  LogMessage local_60;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x2f70);
    pLVar4 = internal::LogMessage::operator<<(&local_60,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_98,pLVar4);
    internal::LogMessage::~LogMessage(&local_60);
  }
  internal::ExtensionSet::MergeFrom(&this->_extensions_,&from->_extensions_);
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x61d);
    pLVar4 = internal::LogMessage::operator<<(&local_98,"CHECK failed: (&other) != (this): ");
    internal::LogFinisher::operator=(&local_99,pLVar4);
    internal::LogMessage::~LogMessage(&local_98);
  }
  iVar5 = (from->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar5 != 0) {
    pRVar3 = (from->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
    our_elems = internal::RepeatedPtrFieldBase::InternalExtend
                          (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,iVar5);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
              (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,our_elems,pRVar3->elements,
               iVar5,((this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_)->allocated_size
                     - (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_);
    iVar5 = iVar5 + (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
    (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar5;
    pRVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar3->allocated_size < iVar5) {
      pRVar3->allocated_size = iVar5;
    }
  }
  if (((from->_has_bits_).has_bits_[0] & 1) != 0) {
    bVar1 = from->deprecated_;
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 1;
    this->deprecated_ = bVar1;
  }
  return;
}

Assistant:

void EnumValueOptions::MergeFrom(const EnumValueOptions& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.EnumValueOptions)
  GOOGLE_DCHECK_NE(&from, this);
  _extensions_.MergeFrom(from._extensions_);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  uninterpreted_option_.MergeFrom(from.uninterpreted_option_);
  if (from.has_deprecated()) {
    set_deprecated(from.deprecated());
  }
}